

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::Reader::getLocationLineAndColumn(Reader *this,Location location,int *line,int *column)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  Char c;
  Location lastLineStart;
  Location current;
  int *column_local;
  int *line_local;
  Location location_local;
  Reader *this_local;
  
  lastLineStart = this->begin_;
  *line = 0;
  current = lastLineStart;
  while( true ) {
    bVar3 = false;
    if (current < location) {
      bVar3 = current != this->end_;
    }
    if (!bVar3) break;
    pcVar2 = current + 1;
    cVar1 = *current;
    if (cVar1 == '\r') {
      if (*pcVar2 == '\n') {
        pcVar2 = current + 2;
      }
      current = pcVar2;
      lastLineStart = current;
      *line = *line + 1;
    }
    else {
      current = pcVar2;
      if (cVar1 == '\n') {
        *line = *line + 1;
        lastLineStart = pcVar2;
      }
    }
  }
  *column = ((int)location - (int)lastLineStart) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void Reader::getLocationLineAndColumn(Location location,
                                      int& line,
                                      int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (*current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}